

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O3

void apply_imputation_results<PredictionData<double,long>,ImputedData<long,long_double>>
               (PredictionData<double,_long> *prediction_data,ImputedData<long,_long_double> *imp,
               Imputer *imputer,size_t row)

{
  longdouble lVar1;
  bool bVar2;
  pointer puVar3;
  pointer plVar4;
  pointer plVar5;
  pointer pdVar6;
  double *pdVar7;
  long lVar8;
  pointer plVar9;
  pointer pvVar10;
  pointer pvVar11;
  int *piVar12;
  pointer piVar13;
  unsigned_long uVar14;
  longdouble *plVar15;
  longdouble *plVar16;
  long lVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  long lVar21;
  longdouble *plVar22;
  int iVar23;
  longdouble *plVar24;
  longdouble lVar25;
  longdouble lVar26;
  double dVar27;
  long local_78;
  ushort uStack_70;
  long local_68;
  ushort uStack_60;
  long local_58;
  ushort uStack_50;
  
  bVar2 = prediction_data->is_col_major;
  sVar19 = imp->n_missing_num;
  if (bVar2 == false) {
    if (sVar19 != 0) {
      puVar3 = (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      plVar4 = (imp->num_sum).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
               super__Vector_impl_data._M_start;
      plVar5 = (imp->num_weight).super__Vector_base<long_double,_std::allocator<long_double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar6 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar18 = imputer->ncols_numeric;
      pdVar7 = prediction_data->numeric_data;
      lVar21 = 0;
      lVar25 = (longdouble)0;
      do {
        lVar8 = *(long *)((long)puVar3 + lVar21);
        lVar1 = *(longdouble *)((long)plVar5 + lVar21 * 2);
        if (lVar1 <= lVar25) {
LAB_00212ce6:
          dVar27 = pdVar6[lVar8];
        }
        else {
          lVar26 = *(longdouble *)((long)plVar4 + lVar21 * 2);
          uStack_50 = (ushort)((unkuint10)lVar26 >> 0x40);
          local_58 = SUB108(lVar26,0);
          if (((unkuint10)lVar26 & 0x7fff) != 0 &&
              (0x7ffd < (ushort)((uStack_50 & 0x7fff) - 1) || -1 < local_58)) goto LAB_00212ce6;
          if (((lVar26 == lVar25) && (!NAN(lVar26) && !NAN(lVar25))) && (NAN(pdVar6[lVar8])))
          goto LAB_00212ce6;
          dVar27 = (double)(lVar26 / lVar1);
        }
        pdVar7[sVar18 * row + lVar8] = dVar27;
        lVar21 = lVar21 + 8;
        sVar19 = sVar19 - 1;
      } while (sVar19 != 0);
    }
  }
  else if (sVar19 != 0) {
    puVar3 = (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    plVar4 = (imp->num_sum).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar5 = (imp->num_weight).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl
             .super__Vector_impl_data._M_start;
    pdVar6 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar18 = prediction_data->nrows;
    pdVar7 = prediction_data->numeric_data;
    lVar21 = 0;
    lVar25 = (longdouble)0;
    do {
      lVar8 = *(long *)((long)puVar3 + lVar21);
      lVar1 = *(longdouble *)((long)plVar5 + lVar21 * 2);
      if (lVar1 <= lVar25) {
LAB_00212c1d:
        dVar27 = pdVar6[lVar8];
      }
      else {
        lVar26 = *(longdouble *)((long)plVar4 + lVar21 * 2);
        uStack_60 = (ushort)((unkuint10)lVar26 >> 0x40);
        local_68 = SUB108(lVar26,0);
        if (((unkuint10)lVar26 & 0x7fff) != 0 &&
            (0x7ffd < (ushort)((uStack_60 & 0x7fff) - 1) || -1 < local_68)) goto LAB_00212c1d;
        if (((lVar26 == lVar25) && (!NAN(lVar26) && !NAN(lVar25))) && (NAN(pdVar6[lVar8])))
        goto LAB_00212c1d;
        dVar27 = (double)(lVar26 / lVar1);
      }
      pdVar7[row + lVar8 * sVar18] = dVar27;
      lVar21 = lVar21 + 8;
      sVar19 = sVar19 - 1;
    } while (sVar19 != 0);
  }
  pdVar7 = prediction_data->Xr;
  if (pdVar7 != (double *)0x0) {
    lVar21 = prediction_data->Xr_indptr[row];
    lVar8 = prediction_data->Xr_indptr[row + 1];
    if (lVar21 < lVar8) {
      plVar4 = (imp->sp_num_sum).super__Vector_base<long_double,_std::allocator<long_double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      plVar5 = (imp->sp_num_weight).super__Vector_base<long_double,_std::allocator<long_double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      plVar9 = (imp->missing_sp).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar17 = 0;
      do {
        if (0x7fefffffffffffff < (ulong)ABS(pdVar7[lVar21])) {
          lVar25 = plVar5[lVar17];
          if (lVar25 <= (longdouble)0) {
LAB_00212dea:
            dVar27 = pdVar6[plVar9[lVar17]];
          }
          else {
            lVar1 = plVar4[lVar17];
            uStack_70 = (ushort)((unkuint10)lVar1 >> 0x40);
            local_78 = SUB108(lVar1,0);
            if (((unkuint10)lVar1 & 0x7fff) != 0 &&
                (0x7ffd < (ushort)((uStack_70 & 0x7fff) - 1) || -1 < local_78)) goto LAB_00212dea;
            dVar27 = (double)(lVar1 / lVar25);
          }
          pdVar7[lVar21] = dVar27;
          lVar17 = lVar17 + 1;
        }
        lVar21 = lVar21 + 1;
      } while (lVar8 != lVar21);
    }
  }
  sVar19 = imp->n_missing_cat;
  if (bVar2 == false) {
    if (sVar19 != 0) {
      puVar3 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar21 = row * imputer->ncols_categ;
      pvVar10 = (imp->cat_sum).
                super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      piVar12 = prediction_data->categ_data;
      pvVar11 = (imp->cat_sum).
                super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      piVar13 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      sVar18 = 0;
      do {
        uVar14 = puVar3[sVar18];
        plVar15 = pvVar10[uVar14].super__Vector_base<long_double,_std::allocator<long_double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        plVar16 = pvVar10[uVar14].super__Vector_base<long_double,_std::allocator<long_double>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        plVar22 = plVar15 + 1;
        plVar24 = plVar15;
        if (plVar22 != plVar16 && plVar15 != plVar16) {
          lVar25 = *plVar15;
          do {
            lVar1 = *plVar22;
            lVar26 = lVar25;
            if (lVar25 <= lVar1 || lVar1 != lVar25) {
              lVar26 = lVar1;
            }
            if (lVar25 < lVar1) {
              plVar24 = plVar22;
            }
            plVar22 = plVar22 + 1;
            lVar25 = lVar26;
          } while (plVar22 != plVar16);
        }
        iVar23 = (int)((ulong)((long)plVar24 - (long)plVar15) >> 4);
        piVar12[lVar21 + uVar14] = iVar23;
        if (iVar23 == 0) {
          iVar23 = -1;
          if ((plVar15 != plVar16) && (pvVar10 != pvVar11)) {
            if ((longdouble)0 < *plVar15) goto LAB_00212fbe;
            iVar23 = piVar13[uVar14];
          }
          piVar12[lVar21 + uVar14] = iVar23;
        }
LAB_00212fbe:
        sVar18 = sVar18 + 1;
      } while (sVar18 != sVar19);
    }
  }
  else if (sVar19 != 0) {
    puVar3 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pvVar10 = (imp->cat_sum).
              super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar11 = (imp->cat_sum).
              super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    piVar12 = prediction_data->categ_data;
    sVar18 = prediction_data->nrows;
    piVar13 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    sVar20 = 0;
    do {
      uVar14 = puVar3[sVar20];
      plVar15 = pvVar10[uVar14].super__Vector_base<long_double,_std::allocator<long_double>_>.
                _M_impl.super__Vector_impl_data._M_start;
      plVar16 = pvVar10[uVar14].super__Vector_base<long_double,_std::allocator<long_double>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      plVar22 = plVar15 + 1;
      plVar24 = plVar15;
      if (plVar22 != plVar16 && plVar15 != plVar16) {
        lVar25 = *plVar15;
        do {
          lVar1 = *plVar22;
          lVar26 = lVar25;
          if (lVar25 <= lVar1 || lVar1 != lVar25) {
            lVar26 = lVar1;
          }
          if (lVar25 < lVar1) {
            plVar24 = plVar22;
          }
          plVar22 = plVar22 + 1;
          lVar25 = lVar26;
        } while (plVar22 != plVar16);
      }
      lVar21 = sVar18 * uVar14;
      iVar23 = (int)((ulong)((long)plVar24 - (long)plVar15) >> 4);
      piVar12[row + lVar21] = iVar23;
      if (iVar23 == 0) {
        iVar23 = -1;
        if ((plVar15 != plVar16) && (pvVar10 != pvVar11)) {
          if ((longdouble)0 < *plVar15) goto LAB_00212ef1;
          iVar23 = piVar13[uVar14];
        }
        piVar12[row + lVar21] = iVar23;
      }
LAB_00212ef1:
      sVar20 = sVar20 + 1;
    } while (sVar20 != sVar19);
  }
  return;
}

Assistant:

void apply_imputation_results(PredictionData  &prediction_data,
                              ImputedData     &imp,
                              Imputer         &imputer,
                              size_t          row)
{
    size_t col;
    size_t pos = 0;
    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imputer.col_means[col];
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imputer.col_means[col];
        }
    }

    if (prediction_data.Xr != NULL)
        for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
        {
            if (is_na_or_inf(prediction_data.Xr[ix]))
            {
                if (imp.sp_num_weight[pos] > 0 && !is_na_or_inf(imp.sp_num_sum[pos]))
                    prediction_data.Xr[ix]
                        =
                    imp.sp_num_sum[pos] / imp.sp_num_weight[pos];
                else
                    prediction_data.Xr[ix]
                        =
                    imputer.col_means[imp.missing_sp[pos]];
                pos++;
            }
        }

    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[row + col * prediction_data.nrows] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows] = -1;
                }

                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[col + row * imputer.ncols_categ] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ] = -1;
                }
                
                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }
}